

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_record.c
# Opt level: O0

TRef lj_record_idx(jit_State *J,RecordIndex *ix)

{
  char cVar1;
  short sVar2;
  IRRef1 IVar3;
  BCReg BVar4;
  TRef TVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  TRef *pTVar9;
  TValue *pTVar10;
  GCtab *t_00;
  RecordIndex *in_RSI;
  jit_State *in_RDI;
  bool bVar11;
  bool bVar12;
  TRef fref;
  IRType t_1;
  TRef mtref;
  TRef key;
  cTValue *mo;
  int hasmm;
  int keybarrier;
  GCtab *mt;
  TRef res;
  IRType t;
  TValue *tv;
  TRef *base;
  BCReg func;
  cTValue *oldv;
  IROp loadop;
  IROp xrefop;
  TRef xref;
  undefined8 in_stack_fffffffffffffd88;
  TraceError e;
  undefined6 in_stack_fffffffffffffd90;
  undefined2 in_stack_fffffffffffffd96;
  jit_State *in_stack_fffffffffffffd98;
  undefined6 in_stack_fffffffffffffda0;
  IRRef1 in_stack_fffffffffffffda6;
  undefined8 in_stack_fffffffffffffda8;
  undefined6 in_stack_fffffffffffffdb0;
  undefined2 in_stack_fffffffffffffdb6;
  cTValue *local_228;
  undefined4 in_stack_fffffffffffffde8;
  undefined4 in_stack_fffffffffffffdec;
  cTValue *in_stack_fffffffffffffdf0;
  TRef local_1f8;
  IRRef1 IVar13;
  MMS in_stack_fffffffffffffe3c;
  jit_State *pjVar14;
  ushort local_14;
  uint local_4;
  
  do {
    if ((in_RSI->tab & 0x1f000000) == 0xb000000) {
      if (((in_RSI->keyv).field_2.it == 0xffffffff) ||
         (((in_RSI->keyv).field_2.it < 0xfffeffff &&
          (((in_RSI->keyv).n != (in_RSI->keyv).n || (NAN((in_RSI->keyv).n) || NAN((in_RSI->keyv).n))
           ))))) {
        if (in_RSI->val != 0) {
          lj_trace_err((jit_State *)CONCAT26(in_stack_fffffffffffffd96,in_stack_fffffffffffffd90),
                       (TraceError)((ulong)in_stack_fffffffffffffd88 >> 0x20));
        }
        if ((in_RSI->key & 0xffff) < 0x8000) {
          if ((in_RSI->idxchain == 0) ||
             (iVar6 = lj_record_mm_lookup(in_RDI,in_RSI,in_stack_fffffffffffffe3c), iVar6 == 0)) {
            return 0x7fff;
          }
          goto LAB_0014bc50;
        }
      }
      in_stack_fffffffffffffe3c =
           rec_idx_key((jit_State *)&in_stack_fffffffffffffdf0->field_2,
                       (RecordIndex *)CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8))
      ;
      cVar1 = *(char *)((long)(in_RDI->cur).ir + (ulong)(in_stack_fffffffffffffe3c & 0xffff) * 8 + 5
                       );
      iVar6 = 0x41;
      if (cVar1 == '8') {
        iVar6 = 0x40;
      }
      if (cVar1 == '\x19') {
        local_228 = (cTValue *)
                    (ulong)(in_RDI->cur).ir[in_stack_fffffffffffffe3c & 0xffff].field_1.op12;
      }
      else {
        local_228 = in_RSI->oldv;
      }
      if (in_RSI->val == 0) {
        if ((local_228->field_2).it < 0xfffeffff) {
          local_4 = 0xe;
        }
        else if ((int)(local_228->field_2).it >> 0xf == -2) {
          local_4 = 3;
        }
        else {
          local_4 = (local_228->field_2).it ^ 0xffffffff;
        }
        IVar3 = (IRRef1)in_stack_fffffffffffffe3c;
        if (local_228 == (cTValue *)(in_RDI[-1].penalty + 0x38)) {
          pjVar14 = in_RDI;
          TVar5 = lj_ir_kptr_((jit_State *)
                              CONCAT26(in_stack_fffffffffffffdb6,in_stack_fffffffffffffdb0),
                              (IROp)((ulong)in_stack_fffffffffffffda8 >> 0x20),
                              (void *)CONCAT26(in_stack_fffffffffffffda6,in_stack_fffffffffffffda0))
          ;
          (in_RDI->fold).ins.field_0.ot = 0x885;
          (in_RDI->fold).ins.field_0.op1 = IVar3;
          (in_RDI->fold).ins.field_0.op2 = (IRRef1)TVar5;
          lj_opt_fold(in_stack_fffffffffffffd98);
          local_1f8 = 0x7fff;
          in_RDI = pjVar14;
        }
        else {
          (in_RDI->fold).ins.field_0.ot = (ushort)(iVar6 << 8) | (ushort)local_4 | 0x80;
          (in_RDI->fold).ins.field_0.op1 = IVar3;
          (in_RDI->fold).ins.field_0.op2 = 0;
          local_1f8 = lj_opt_fold(in_stack_fffffffffffffd98);
        }
        if (((local_4 != 0) || (in_RSI->idxchain == 0)) ||
           (iVar6 = lj_record_mm_lookup(in_RDI,in_RSI,in_stack_fffffffffffffe3c), iVar6 == 0)) {
          if (local_4 < 3) {
            local_1f8 = local_4 * 0xffffff + 0x7fff;
          }
          return local_1f8;
        }
      }
      else {
        t_00 = (GCtab *)(ulong)*(uint *)((ulong)(in_RSI->tabv).u32.lo + 0x10);
        bVar11 = false;
        if ((in_RSI->key >> 0x18 & 0x1f) - 4 < 9) {
          bVar11 = (in_RSI->val & 0x1f000000) != 0;
        }
        if ((local_228->field_2).it != 0xffffffff) {
          iVar7 = lj_opt_fwd_wasnonnil(in_RDI,(IROpT)iVar6,in_stack_fffffffffffffe3c & 0xffff);
          IVar3 = (IRRef1)in_stack_fffffffffffffe3c;
          if (iVar7 == 0) {
            if (cVar1 == ':') {
              pjVar14 = in_RDI;
              IVar13 = IVar3;
              TVar5 = lj_ir_kptr_((jit_State *)CONCAT26(IVar3,in_stack_fffffffffffffdb0),
                                  (IROp)((ulong)in_RDI >> 0x20),
                                  (void *)CONCAT26(in_stack_fffffffffffffda6,
                                                   in_stack_fffffffffffffda0));
              (in_RDI->fold).ins.field_0.ot = 0x985;
              (in_RDI->fold).ins.field_0.op1 = IVar3;
              (in_RDI->fold).ins.field_0.op2 = (IRRef1)TVar5;
              IVar3 = IVar13;
              lj_opt_fold(in_stack_fffffffffffffd98);
              in_RDI = pjVar14;
            }
            if (in_RSI->idxchain != 0) {
              if (t_00 == (GCtab *)0x0) {
                TVar5 = in_RSI->tab;
                (in_RDI->fold).ins.field_0.ot = 0x430b;
                (in_RDI->fold).ins.field_0.op1 = (IRRef1)TVar5;
                (in_RDI->fold).ins.field_0.op2 = 3;
                TVar5 = lj_opt_fold(in_stack_fffffffffffffd98);
                in_stack_fffffffffffffd98 = in_RDI;
                in_stack_fffffffffffffda6 = (IRRef1)TVar5;
                in_RDI = in_stack_fffffffffffffd98;
                TVar5 = lj_ir_knull((jit_State *)
                                    CONCAT26(in_stack_fffffffffffffda6,in_stack_fffffffffffffda0),
                                    (IRType)((ulong)in_stack_fffffffffffffd98 >> 0x20));
                (in_stack_fffffffffffffd98->fold).ins.field_0.ot = 0x88b;
                (in_stack_fffffffffffffd98->fold).ins.field_0.op1 = in_stack_fffffffffffffda6;
                (in_stack_fffffffffffffd98->fold).ins.field_0.op2 = (IRRef1)TVar5;
                lj_opt_fold(in_stack_fffffffffffffd98);
              }
              else {
                if ((local_228->field_2).it < 0xfffeffff) {
                  local_14 = 0xe;
                }
                else if ((int)(local_228->field_2).it >> 0xf == -2) {
                  local_14 = 3;
                }
                else {
                  local_14 = (ushort)(local_228->field_2).it ^ 0xffff;
                }
                (in_RDI->fold).ins.field_0.ot = (ushort)(iVar6 << 8) | local_14 | 0x80;
                (in_RDI->fold).ins.field_0.op1 = IVar3;
                (in_RDI->fold).ins.field_0.op2 = 0;
                lj_opt_fold(in_stack_fffffffffffffd98);
              }
            }
          }
          else {
            bVar11 = false;
          }
LAB_0014cb4a:
          if ((in_RSI->val >> 0x18 & 0x1f) - 0xf < 5) {
            TVar5 = in_RSI->val;
            (in_RDI->fold).ins.field_0.ot = 0x550e;
            (in_RDI->fold).ins.field_0.op1 = (IRRef1)TVar5;
            (in_RDI->fold).ins.field_0.op2 = 0x1d3;
            TVar5 = lj_opt_fold(in_stack_fffffffffffffd98);
            in_RSI->val = TVar5;
          }
          TVar5 = in_RSI->val;
          (in_RDI->fold).ins.field_0.ot =
               ((IROpT)iVar6 + 7) * 0x100 | (byte)(in_RSI->val >> 0x18) & 0x1f;
          (in_RDI->fold).ins.field_0.op1 = IVar3;
          (in_RDI->fold).ins.field_0.op2 = (IRRef1)TVar5;
          lj_opt_fold(in_stack_fffffffffffffd98);
          if ((bVar11) || ((in_RSI->val >> 0x18 & 0x1f) - 4 < 9)) {
            TVar5 = in_RSI->tab;
            (in_RDI->fold).ins.field_0.ot = 0x5200;
            (in_RDI->fold).ins.field_0.op1 = (IRRef1)TVar5;
            (in_RDI->fold).ins.field_0.op2 = 0;
            lj_opt_fold(in_stack_fffffffffffffd98);
          }
          iVar6 = nommstr(in_RDI,in_RSI->key);
          pjVar14 = in_RDI;
          if (iVar6 == 0) {
            TVar5 = in_RSI->tab;
            (in_RDI->fold).ins.field_0.ot = 0x3e05;
            (in_RDI->fold).ins.field_0.op1 = (IRRef1)TVar5;
            (in_RDI->fold).ins.field_0.op2 = 8;
            TVar5 = lj_opt_fold(in_stack_fffffffffffffd98);
            IVar3 = (IRRef1)TVar5;
            pjVar14 = in_RDI;
            TVar5 = lj_ir_kint((jit_State *)
                               CONCAT26(in_stack_fffffffffffffda6,in_stack_fffffffffffffda0),
                               (int32_t)((ulong)in_stack_fffffffffffffd98 >> 0x20));
            (in_RDI->fold).ins.field_0.ot = 0x4a10;
            (in_RDI->fold).ins.field_0.op1 = IVar3;
            (in_RDI->fold).ins.field_0.op2 = (IRRef1)TVar5;
            lj_opt_fold(in_stack_fffffffffffffd98);
          }
          pjVar14->needsnap = '\x01';
          return 0;
        }
        bVar12 = false;
        pjVar14 = in_RDI;
        if ((in_RSI->idxchain != 0) && (t_00 != (GCtab *)0x0)) {
          in_stack_fffffffffffffdf0 =
               lj_tab_getstr(t_00,(GCstr *)(ulong)in_RDI[-1].bpropcache[10].mode);
          bVar12 = false;
          pjVar14 = in_RDI;
          if (in_stack_fffffffffffffdf0 != (cTValue *)0x0) {
            bVar12 = (in_stack_fffffffffffffdf0->field_2).it != 0xffffffff;
          }
        }
        IVar3 = (IRRef1)in_stack_fffffffffffffe3c;
        if (bVar12) {
          (pjVar14->fold).ins.field_0.ot = (ushort)(iVar6 << 8) | 0x80;
          (pjVar14->fold).ins.field_0.op1 = IVar3;
          (pjVar14->fold).ins.field_0.op2 = 0;
          lj_opt_fold(in_stack_fffffffffffffd98);
          in_RDI = pjVar14;
        }
        else {
          in_RDI = pjVar14;
          if (cVar1 == ':') {
            sVar2 = 9;
            if (local_228 == (cTValue *)(pjVar14[-1].penalty + 0x38)) {
              sVar2 = 8;
            }
            TVar5 = lj_ir_kptr_((jit_State *)
                                CONCAT26(in_stack_fffffffffffffdb6,in_stack_fffffffffffffdb0),
                                (IROp)((ulong)in_stack_fffffffffffffda8 >> 0x20),
                                (void *)CONCAT26(in_stack_fffffffffffffda6,in_stack_fffffffffffffda0
                                                ));
            (pjVar14->fold).ins.field_0.ot = sVar2 << 8 | 0x85;
            (pjVar14->fold).ins.field_0.op1 = IVar3;
            (pjVar14->fold).ins.field_0.op2 = (IRRef1)TVar5;
            lj_opt_fold(in_stack_fffffffffffffd98);
          }
        }
        if ((in_RSI->idxchain == 0) ||
           (iVar7 = lj_record_mm_lookup(in_RDI,in_RSI,in_stack_fffffffffffffe3c), iVar7 == 0)) {
          IVar3 = (IRRef1)in_stack_fffffffffffffe3c;
          if (local_228 == (cTValue *)(in_RDI[-1].penalty + 0x38)) {
            uVar8 = in_RSI->key;
            if ((uVar8 >> 0x18 & 0x1f) - 0xf < 5) {
              (in_RDI->fold).ins.field_0.ot = 0x550e;
              (in_RDI->fold).ins.field_0.op1 = (IRRef1)uVar8;
              (in_RDI->fold).ins.field_0.op2 = 0x1d3;
              uVar8 = lj_opt_fold(in_stack_fffffffffffffd98);
            }
            TVar5 = in_RSI->tab;
            (in_RDI->fold).ins.field_0.ot = 0x3b05;
            (in_RDI->fold).ins.field_0.op1 = (IRRef1)TVar5;
            (in_RDI->fold).ins.field_0.op2 = (IRRef1)uVar8;
            TVar5 = lj_opt_fold(in_stack_fffffffffffffd98);
            IVar3 = (IRRef1)TVar5;
            bVar11 = false;
          }
          goto LAB_0014cb4a;
        }
      }
    }
    else {
      iVar6 = lj_record_mm_lookup(in_RDI,in_RSI,in_stack_fffffffffffffe3c);
      if (iVar6 == 0) {
        lj_trace_err((jit_State *)CONCAT26(in_stack_fffffffffffffd96,in_stack_fffffffffffffd90),
                     (TraceError)((ulong)in_stack_fffffffffffffd88 >> 0x20));
      }
    }
LAB_0014bc50:
    e = (TraceError)((ulong)in_stack_fffffffffffffd88 >> 0x20);
    if ((in_RSI->mobj & 0x1f000000) == 0x8000000) {
      BVar4 = rec_mm_prep((jit_State *)CONCAT26(in_stack_fffffffffffffda6,in_stack_fffffffffffffda0)
                          ,(ASMFunction)in_stack_fffffffffffffd98);
      pTVar9 = in_RDI->base + BVar4;
      pTVar10 = in_RDI->L->base + BVar4;
      *pTVar9 = in_RSI->mobj;
      pTVar9[1] = in_RSI->tab;
      pTVar9[2] = in_RSI->key;
      (pTVar10->field_2).field_0 = (in_RSI->mobjv).field_2.field_0;
      (pTVar10->field_2).it = 0xfffffff7;
      pTVar10[1].field_2 = (anon_struct_8_2_fd66bcdd_for_TValue_2)in_RSI->tabv;
      pTVar10[2] = in_RSI->keyv;
      if (in_RSI->val == 0) {
        lj_record_call((jit_State *)CONCAT26(in_stack_fffffffffffffd96,in_stack_fffffffffffffd90),e,
                       0x14bf1f);
      }
      else {
        pTVar9[3] = in_RSI->val;
        pTVar10[3] = in_RSI->valv;
        lj_record_call((jit_State *)CONCAT26(in_stack_fffffffffffffd96,in_stack_fffffffffffffd90),e,
                       0x14bef6);
      }
      return 0;
    }
    in_RSI->tab = in_RSI->mobj;
    in_RSI->tabv = in_RSI->mobjv;
    iVar6 = in_RSI->idxchain + -1;
    in_RSI->idxchain = iVar6;
    if (iVar6 == 0) {
      lj_trace_err((jit_State *)CONCAT26(in_stack_fffffffffffffd96,in_stack_fffffffffffffd90),e);
    }
  } while( true );
}

Assistant:

TRef lj_record_idx(jit_State *J, RecordIndex *ix)
{
  TRef xref;
  IROp xrefop, loadop;
  cTValue *oldv;

  while (!tref_istab(ix->tab)) { /* Handle non-table lookup. */
    /* Never call raw lj_record_idx() on non-table. */
    lua_assert(ix->idxchain != 0);
    if (!lj_record_mm_lookup(J, ix, ix->val ? MM_newindex : MM_index))
      lj_trace_err(J, LJ_TRERR_NOMM);
  handlemm:
    if (tref_isfunc(ix->mobj)) {  /* Handle metamethod call. */
      BCReg func = rec_mm_prep(J, ix->val ? lj_cont_nop : lj_cont_ra);
      TRef *base = J->base + func;
      TValue *tv = J->L->base + func;
      base[0] = ix->mobj; base[1] = ix->tab; base[2] = ix->key;
      setfuncV(J->L, tv+0, funcV(&ix->mobjv));
      copyTV(J->L, tv+1, &ix->tabv);
      copyTV(J->L, tv+2, &ix->keyv);
      if (ix->val) {
	base[3] = ix->val;
	copyTV(J->L, tv+3, &ix->valv);
	lj_record_call(J, func, 3);  /* mobj(tab, key, val) */
	return 0;
      } else {
	lj_record_call(J, func, 2);  /* res = mobj(tab, key) */
	return 0;  /* No result yet. */
      }
    }
    /* Otherwise retry lookup with metaobject. */
    ix->tab = ix->mobj;
    copyTV(J->L, &ix->tabv, &ix->mobjv);
    if (--ix->idxchain == 0)
      lj_trace_err(J, LJ_TRERR_IDXLOOP);
  }

  /* First catch nil and NaN keys for tables. */
  if (tvisnil(&ix->keyv) || (tvisnum(&ix->keyv) && tvisnan(&ix->keyv))) {
    if (ix->val)  /* Better fail early. */
      lj_trace_err(J, LJ_TRERR_STORENN);
    if (tref_isk(ix->key)) {
      if (ix->idxchain && lj_record_mm_lookup(J, ix, MM_index))
	goto handlemm;
      return TREF_NIL;
    }
  }

  /* Record the key lookup. */
  xref = rec_idx_key(J, ix);
  xrefop = IR(tref_ref(xref))->o;
  loadop = xrefop == IR_AREF ? IR_ALOAD : IR_HLOAD;
  /* The lj_meta_tset() inconsistency is gone, but better play safe. */
  oldv = xrefop == IR_KKPTR ? (cTValue *)ir_kptr(IR(tref_ref(xref))) : ix->oldv;

  if (ix->val == 0) {  /* Indexed load */
    IRType t = itype2irt(oldv);
    TRef res;
    if (oldv == niltvg(J2G(J))) {
      emitir(IRTG(IR_EQ, IRT_P32), xref, lj_ir_kkptr(J, niltvg(J2G(J))));
      res = TREF_NIL;
    } else {
      res = emitir(IRTG(loadop, t), xref, 0);
    }
    if (t == IRT_NIL && ix->idxchain && lj_record_mm_lookup(J, ix, MM_index))
      goto handlemm;
    if (irtype_ispri(t)) res = TREF_PRI(t);  /* Canonicalize primitives. */
    return res;
  } else {  /* Indexed store. */
    GCtab *mt = tabref(tabV(&ix->tabv)->metatable);
    int keybarrier = tref_isgcv(ix->key) && !tref_isnil(ix->val);
    if (tvisnil(oldv)) {  /* Previous value was nil? */
      /* Need to duplicate the hasmm check for the early guards. */
      int hasmm = 0;
      if (ix->idxchain && mt) {
	cTValue *mo = lj_tab_getstr(mt, mmname_str(J2G(J), MM_newindex));
	hasmm = mo && !tvisnil(mo);
      }
      if (hasmm)
	emitir(IRTG(loadop, IRT_NIL), xref, 0);  /* Guard for nil value. */
      else if (xrefop == IR_HREF)
	emitir(IRTG(oldv == niltvg(J2G(J)) ? IR_EQ : IR_NE, IRT_P32),
	       xref, lj_ir_kkptr(J, niltvg(J2G(J))));
      if (ix->idxchain && lj_record_mm_lookup(J, ix, MM_newindex)) {
	lua_assert(hasmm);
	goto handlemm;
      }
      lua_assert(!hasmm);
      if (oldv == niltvg(J2G(J))) {  /* Need to insert a new key. */
	TRef key = ix->key;
	if (tref_isinteger(key))  /* NEWREF needs a TValue as a key. */
	  key = emitir(IRTN(IR_CONV), key, IRCONV_NUM_INT);
	xref = emitir(IRT(IR_NEWREF, IRT_P32), ix->tab, key);
	keybarrier = 0;  /* NEWREF already takes care of the key barrier. */
      }
    } else if (!lj_opt_fwd_wasnonnil(J, loadop, tref_ref(xref))) {
      /* Cannot derive that the previous value was non-nil, must do checks. */
      if (xrefop == IR_HREF)  /* Guard against store to niltv. */
	emitir(IRTG(IR_NE, IRT_P32), xref, lj_ir_kkptr(J, niltvg(J2G(J))));
      if (ix->idxchain) {  /* Metamethod lookup required? */
	/* A check for NULL metatable is cheaper (hoistable) than a load. */
	if (!mt) {
	  TRef mtref = emitir(IRT(IR_FLOAD, IRT_TAB), ix->tab, IRFL_TAB_META);
	  emitir(IRTG(IR_EQ, IRT_TAB), mtref, lj_ir_knull(J, IRT_TAB));
	} else {
	  IRType t = itype2irt(oldv);
	  emitir(IRTG(loadop, t), xref, 0);  /* Guard for non-nil value. */
	}
      }
    } else {
      keybarrier = 0;  /* Previous non-nil value kept the key alive. */
    }
    /* Convert int to number before storing. */
    if (!LJ_DUALNUM && tref_isinteger(ix->val))
      ix->val = emitir(IRTN(IR_CONV), ix->val, IRCONV_NUM_INT);
    emitir(IRT(loadop+IRDELTA_L2S, tref_type(ix->val)), xref, ix->val);
    if (keybarrier || tref_isgcv(ix->val))
      emitir(IRT(IR_TBAR, IRT_NIL), ix->tab, 0);
    /* Invalidate neg. metamethod cache for stores with certain string keys. */
    if (!nommstr(J, ix->key)) {
      TRef fref = emitir(IRT(IR_FREF, IRT_P32), ix->tab, IRFL_TAB_NOMM);
      emitir(IRT(IR_FSTORE, IRT_U8), fref, lj_ir_kint(J, 0));
    }
    J->needsnap = 1;
    return 0;
  }
}